

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall google::protobuf::MethodDescriptorProto::SharedCtor(MethodDescriptorProto *this)

{
  internal::InitSCC(&scc_info_MethodDescriptorProto_google_2fprotobuf_2fdescriptor_2eproto.base);
  (this->name_).ptr_ = (string *)internal::fixed_address_empty_string_abi_cxx11_;
  (this->input_type_).ptr_ = (string *)internal::fixed_address_empty_string_abi_cxx11_;
  (this->output_type_).ptr_ = (string *)internal::fixed_address_empty_string_abi_cxx11_;
  this->options_ = (MethodOptions *)0x0;
  this->client_streaming_ = false;
  this->server_streaming_ = false;
  return;
}

Assistant:

void MethodDescriptorProto::SharedCtor() {
  ::PROTOBUF_NAMESPACE_ID::internal::InitSCC(&scc_info_MethodDescriptorProto_google_2fprotobuf_2fdescriptor_2eproto.base);
  name_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  input_type_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  output_type_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  ::memset(&options_, 0, static_cast<size_t>(
      reinterpret_cast<char*>(&server_streaming_) -
      reinterpret_cast<char*>(&options_)) + sizeof(server_streaming_));
}